

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_tab.c
# Opt level: O2

void lj_tab_resize(lua_State *L,GCtab *t,uint32_t asize,uint32_t hbits)

{
  undefined4 *puVar1;
  uint uVar2;
  uint64_t uVar3;
  undefined8 *puVar4;
  void *pvVar5;
  void *pvVar6;
  uint64_t uVar7;
  TValue *pTVar8;
  long lVar9;
  ulong uVar10;
  uint uVar11;
  uint uVar12;
  ulong uVar13;
  TValue *pTVar14;
  ulong uVar15;
  long lVar16;
  
  uVar3 = (t->node).ptr64;
  uVar12 = t->asize;
  uVar13 = (ulong)uVar12;
  uVar2 = t->hmask;
  uVar10 = (ulong)asize;
  if (uVar12 < asize) {
    if (0x8000001 < asize) goto LAB_00125b4a;
    pvVar6 = (void *)(t->array).ptr64;
    if (t->colo < '\x01') {
      pvVar5 = lj_mem_realloc(L,pvVar6,uVar13 * 8,(ulong)(asize * 8));
    }
    else {
      pvVar5 = lj_mem_realloc(L,(void *)0x0,0,(ulong)(asize * 8));
      t->colo = t->colo | 0x80;
      for (uVar15 = 0; uVar13 != uVar15; uVar15 = uVar15 + 1) {
        *(undefined8 *)((long)pvVar5 + uVar15 * 8) = *(undefined8 *)((long)pvVar6 + uVar15 * 8);
      }
    }
    (t->array).ptr64 = (uint64_t)pvVar5;
    t->asize = asize;
    for (uVar15 = uVar13; uVar15 < uVar10; uVar15 = uVar15 + 1) {
      *(undefined8 *)((long)pvVar5 + uVar15 * 8) = 0xffffffffffffffff;
    }
  }
  if (hbits == 0) {
    uVar7 = (L->glref).ptr64 + 0xf8;
    (t->node).ptr64 = uVar7;
    (t->freetop).ptr64 = uVar7;
    t->hmask = 0;
  }
  else {
    if (0x1a < hbits) {
LAB_00125b4a:
      lj_err_msg(L,LJ_ERR_TABOV);
    }
    uVar11 = 1 << ((byte)hbits & 0x1f);
    pvVar6 = lj_mem_realloc(L,(void *)0x0,0,0x18L << ((byte)hbits & 0x3f));
    (t->node).ptr64 = (uint64_t)pvVar6;
    lVar9 = (ulong)uVar11 * 0x18;
    (t->freetop).ptr64 = (uint64_t)((long)pvVar6 + lVar9);
    t->hmask = uVar11 - 1;
    for (lVar16 = 0; lVar9 - lVar16 != 0; lVar16 = lVar16 + 0x18) {
      *(undefined8 *)((long)pvVar6 + lVar16 + 0x10) = 0;
      puVar1 = (undefined4 *)((long)pvVar6 + lVar16);
      *puVar1 = 0xffffffff;
      puVar1[1] = 0xffffffff;
      puVar1[2] = 0xffffffff;
      puVar1[3] = 0xffffffff;
    }
  }
  if (asize < uVar12) {
    pvVar6 = (void *)(t->array).ptr64;
    t->asize = asize;
    for (uVar15 = uVar10; uVar15 < uVar13; uVar15 = uVar15 + 1) {
      if (*(long *)((long)pvVar6 + uVar15 * 8) != -1) {
        pTVar8 = lj_tab_setinth(L,t,(int32_t)uVar15);
        *pTVar8 = *(TValue *)((long)pvVar6 + uVar15 * 8);
      }
    }
    if (t->colo < '\x01') {
      pvVar6 = lj_mem_realloc(L,pvVar6,uVar13 << 3,uVar10 << 3);
      (t->array).ptr64 = (uint64_t)pvVar6;
    }
  }
  if ((ulong)uVar2 == 0) {
    return;
  }
  for (uVar12 = 0; uVar12 <= uVar2; uVar12 = uVar12 + 1) {
    if (*(long *)(uVar3 + (ulong)uVar12 * 0x18) != -1) {
      pTVar14 = (TValue *)((ulong)uVar12 * 0x18 + uVar3);
      pTVar8 = lj_tab_set(L,t,pTVar14 + 1);
      *pTVar8 = *pTVar14;
    }
  }
  puVar4 = (undefined8 *)(L->glref).ptr64;
  lVar9 = (ulong)uVar2 * 0x18 + 0x18;
  puVar4[2] = puVar4[2] - lVar9;
  (*(code *)*puVar4)(puVar4[1],uVar3,lVar9,0,(code *)*puVar4);
  return;
}

Assistant:

void lj_tab_resize(lua_State *L, GCtab *t, uint32_t asize, uint32_t hbits)
{
  Node *oldnode = noderef(t->node);
  uint32_t oldasize = t->asize;
  uint32_t oldhmask = t->hmask;
  if (asize > oldasize) {  /* Array part grows? */
    TValue *array;
    uint32_t i;
    if (asize > LJ_MAX_ASIZE)
      lj_err_msg(L, LJ_ERR_TABOV);
    if (LJ_MAX_COLOSIZE != 0 && t->colo > 0) {
      /* A colocated array must be separated and copied. */
      TValue *oarray = tvref(t->array);
      array = lj_mem_newvec(L, asize, TValue);
      t->colo = (int8_t)(t->colo | 0x80);  /* Mark as separated (colo < 0). */
      for (i = 0; i < oldasize; i++)
	copyTV(L, &array[i], &oarray[i]);
    } else {
      array = (TValue *)lj_mem_realloc(L, tvref(t->array),
			  oldasize*sizeof(TValue), asize*sizeof(TValue));
    }
    setmref(t->array, array);
    t->asize = asize;
    for (i = oldasize; i < asize; i++)  /* Clear newly allocated slots. */
      setnilV(&array[i]);
  }
  /* Create new (empty) hash part. */
  if (hbits) {
    newhpart(L, t, hbits);
    clearhpart(t);
  } else {
    global_State *g = G(L);
    setmref(t->node, &g->nilnode);
#if LJ_GC64
    setmref(t->freetop, &g->nilnode);
#endif
    t->hmask = 0;
  }
  if (asize < oldasize) {  /* Array part shrinks? */
    TValue *array = tvref(t->array);
    uint32_t i;
    t->asize = asize;  /* Note: This 'shrinks' even colocated arrays. */
    for (i = asize; i < oldasize; i++)  /* Reinsert old array values. */
      if (!tvisnil(&array[i]))
	copyTV(L, lj_tab_setinth(L, t, (int32_t)i), &array[i]);
    /* Physically shrink only separated arrays. */
    if (LJ_MAX_COLOSIZE != 0 && t->colo <= 0)
      setmref(t->array, lj_mem_realloc(L, array,
	      oldasize*sizeof(TValue), asize*sizeof(TValue)));
  }
  if (oldhmask > 0) {  /* Reinsert pairs from old hash part. */
    global_State *g;
    uint32_t i;
    for (i = 0; i <= oldhmask; i++) {
      Node *n = &oldnode[i];
      if (!tvisnil(&n->val))
	copyTV(L, lj_tab_set(L, t, &n->key), &n->val);
    }
    g = G(L);
    lj_mem_freevec(g, oldnode, oldhmask+1, Node);
  }
}